

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O2

EVP_PKEY * read_key(char *filename)

{
  FILE *fp;
  EVP_PKEY *pEVar1;
  
  fp = fopen(filename,"r");
  if (fp == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot open private key file %s\n",pname,filename);
  }
  else {
    pEVar1 = PEM_read_PrivateKey(fp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (pEVar1 != (EVP_PKEY *)0x0) {
      fclose(fp);
      return (EVP_PKEY *)pEVar1;
    }
    fprintf(_stderr,"%s: error while reading private key %s\n",pname,filename);
    ERR_print_errors_fp(_stderr);
  }
  exit(0x5d);
}

Assistant:

EVP_PKEY *
read_key(char* filename)
{
	FILE *file;
	EVP_PKEY *res;
	/* Read private key file */
#ifdef WIN32
	if ((fopen_s(&file, filename, "r")))
#else
	if (!(file = fopen(filename, "r")))
#endif
	{
	    fprintf(stderr, "%s: cannot open private key file %s\n", pname, filename);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (!(res = PEM_read_PrivateKey(file, NULL, NULL, NULL))) {
	        fprintf(stderr, "%s: error while reading private key %s\n", pname, filename);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	fclose(file);
	return res;
}